

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void add_linear_comb_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,double *res,float *x,double *coef,double x_sd,
               double x_mean,double *fill_val,MissingAction missing_action,double *buffer_arr,
               size_t *buffer_NAs,bool first_run,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  size_t row_1;
  unsigned_long uVar4;
  long lVar5;
  pointer puVar6;
  ulong uVar7;
  unsigned_long *key;
  size_type __n;
  size_t row;
  longdouble lVar8;
  double dVar9;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sorted_ix;
  vector<double,_std::allocator<double>_> obs_weight;
  allocator_type local_b1;
  longdouble local_b0;
  long local_a0;
  double *local_98;
  double local_90;
  double *local_88;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  _Vector_base<double,_std::allocator<double>_> local_68;
  double *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  bVar3 = first_run;
  local_50 = buffer_arr;
  if (first_run) {
    *coef = *coef / x_sd;
  }
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = coef;
  local_90 = x_mean;
  if (first_run && missing_action != Fail) {
    local_80._M_impl.super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)&local_68,(end - st) + 1,
               (value_type_conflict *)&local_80);
  }
  else if (missing_action == Fail) {
    local_b0 = (longdouble)CONCAT28(local_b0._8_2_,*coef);
    for (; st <= end; st = st + 1) {
      dVar9 = fma((double)x[ix_arr[st]] - local_90,local_b0._0_8_,*res);
      *res = dVar9;
      res = res + 1;
    }
    goto LAB_0026b716;
  }
  if (bVar3) {
    local_88 = res + -st;
    key = ix_arr + st;
    local_b0 = (longdouble)0;
    local_a0 = 0;
    __n = 0;
    for (; st <= end; st = st + 1) {
      if ((uint)ABS(x[*key]) < 0x7f800000) {
        pVar10 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::try_emplace<unsigned_long_const&>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,key);
        local_40 = *(double *)((pVar10.first.m_bucket.m_bucket)->m_value + 8);
        local_48 = (double)x[*key];
        dVar9 = fma(local_48 - local_90,*local_98,*res);
        *res = dVar9;
        local_68._M_impl.super__Vector_impl_data._M_start[__n] = local_40;
        local_50[__n] = local_48;
        __n = __n + 1;
        local_38 = local_40;
        local_b0 = local_b0 + (longdouble)local_40;
      }
      else {
        buffer_NAs[local_a0] = st;
        local_a0 = local_a0 + 1;
      }
      key = key + 1;
      res = res + 1;
    }
    local_b0 = local_b0 * (longdouble)0.5;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,__n,&local_b1);
    uVar4 = 0;
    for (puVar6 = local_80._M_impl.super__Vector_impl_data._M_start;
        puVar6 != local_80._M_impl.super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
      *puVar6 = uVar4;
      uVar4 = uVar4 + 1;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>(unsigned_long_const*,unsigned_long,unsigned_long,double*,float_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_80._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_80._M_impl.super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:627:19)>
                )&buffer_arr);
    dVar9 = buffer_arr[local_80._M_impl.super__Vector_impl_data._M_finish[-1]];
    *fill_val = dVar9;
    lVar8 = (longdouble)0;
    for (uVar7 = 0; __n != uVar7; uVar7 = uVar7 + 1) {
      lVar8 = lVar8 + (longdouble)
                      local_68._M_impl.super__Vector_impl_data._M_start
                      [local_80._M_impl.super__Vector_impl_data._M_start[uVar7]];
      if (local_b0 <= lVar8) {
        dVar9 = buffer_arr[local_80._M_impl.super__Vector_impl_data._M_start[uVar7]];
        if (uVar7 < __n - 1 && lVar8 == local_b0) {
          dVar9 = dVar9 + (buffer_arr[local_80._M_impl.super__Vector_impl_data._M_start[uVar7 + 1]]
                          - dVar9) * 0.5;
        }
        *fill_val = dVar9;
        break;
      }
    }
    dVar9 = (dVar9 - local_90) * *local_98;
    *fill_val = dVar9;
    if ((local_a0 != 0) && ((dVar9 != 0.0 || (NAN(dVar9))))) {
      for (lVar5 = 0; local_a0 != lVar5; lVar5 = lVar5 + 1) {
        local_88[buffer_NAs[lVar5]] = local_88[buffer_NAs[lVar5]] + dVar9;
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_80);
  }
  else {
    dVar9 = *local_98;
    dVar1 = *fill_val;
    for (; st <= end; st = st + 1) {
      dVar2 = dVar1;
      if ((uint)ABS(x[ix_arr[st]]) < 0x7f800000) {
        dVar2 = ((double)x[ix_arr[st]] - local_90) * dVar9;
      }
      *res = dVar2 + *res;
      res = res + 1;
    }
  }
LAB_0026b716:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void add_linear_comb_weighted(const size_t ix_arr[], size_t st, size_t end, double *restrict res,
                              const real_t_ *restrict x, double &coef, double x_sd, double x_mean, double &restrict fill_val,
                              MissingAction missing_action, double *restrict buffer_arr,
                              size_t *restrict buffer_NAs, bool first_run, mapping &restrict w)
{
    /* TODO: here don't need the buffer for NAs */

    if (first_run)
        coef /= x_sd;

    size_t cnt = 0;
    size_t cnt_NA = 0;
    double *restrict res_write = res - st;
    ldouble_safe cumw = 0;
    double w_this;
    /* TODO: these buffers should be allocated externally */
    std::vector<double> obs_weight;

    if (first_run && missing_action != Fail)
    {
        obs_weight.resize(end - st + 1, 0.);
    }

    if (missing_action == Fail)
    {    
        for (size_t row = st; row <= end; row++)
            res_write[row] = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
    }

    else
    {
        if (first_run)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (likely(!is_na_or_inf(x[ix_arr[row]])))
                {
                    w_this = w[ix_arr[row]];
                    res_write[row]     = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
                    obs_weight[cnt]    = w_this;
                    buffer_arr[cnt++]  = x[ix_arr[row]];
                    cumw += w_this;
                }

                else
                {
                    buffer_NAs[cnt_NA++] = row;
                }

            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                res_write[row] += (is_na_or_inf(x[ix_arr[row]]))? fill_val : ( (x[ix_arr[row]]-x_mean) * coef );
            }
            return;
        }


        ldouble_safe mid_point = cumw / (ldouble_safe)2;
        std::vector<size_t> sorted_ix(cnt);
        std::iota(sorted_ix.begin(), sorted_ix.end(), (size_t)0);
        std::sort(sorted_ix.begin(), sorted_ix.end(),
                  [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
        ldouble_safe currw = 0;
        fill_val = buffer_arr[sorted_ix.back()]; /* <- will overwrite later */
        /* TODO: is this median calculation correct? should it do a weighted interpolation? */
        for (size_t ix = 0; ix < cnt; ix++)
        {
            currw += obs_weight[sorted_ix[ix]];
            if (currw >= mid_point)
            {
                if (currw == mid_point && ix < cnt-1)
                    fill_val = buffer_arr[sorted_ix[ix]] + (buffer_arr[sorted_ix[ix+1]] - buffer_arr[sorted_ix[ix]]) / 2.0;
                else
                    fill_val = buffer_arr[sorted_ix[ix]];
                break;
            }
        }

        fill_val = (fill_val - x_mean) * coef;
        if (cnt_NA && fill_val)
        {
            for (size_t row = 0; row < cnt_NA; row++)
                res_write[buffer_NAs[row]] += fill_val;
        }

    }
}